

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeInsertCell(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell,int iHeight)

{
  int *piVar1;
  RtreeCoord *aDistance;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  double dVar5;
  RtreeDValue RVar6;
  RtreeDValue RVar7;
  double dVar8;
  RtreeDValue RVar9;
  RtreeDValue RVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  RtreeCoord RVar15;
  RtreeCoord RVar16;
  RtreeCoord RVar17;
  RtreeCoord RVar18;
  RtreeCoord RVar19;
  RtreeCoord RVar20;
  RtreeCoord RVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  bool bVar26;
  ushort uVar27;
  int iVar28;
  int iVar29;
  RtreeNode *pRVar30;
  RtreeCell *aCell;
  RtreeNode *pNode_00;
  void *__s;
  ulong uVar31;
  i64 iVar32;
  uint uVar33;
  ulong uVar34;
  RtreeCell *pRVar35;
  RtreeNode *pRVar36;
  RtreeCoord *pRVar37;
  RtreeCell *pRVar38;
  ulong uVar39;
  uint uVar40;
  RtreeNode *pParent;
  ulong uVar41;
  sqlite3_uint64 n;
  long lVar42;
  long lVar43;
  void *pvVar44;
  ulong uVar45;
  float fVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  RtreeDValue overlap;
  double dVar49;
  int local_10c;
  RtreeCell leftbbox;
  int local_a4;
  double local_a0;
  RtreeCell rightbbox;
  
  if ((0 < iHeight) && (pRVar30 = nodeHashLookup(pRtree,pCell->iRowid), pRVar30 != (RtreeNode *)0x0)
     ) {
    nodeRelease(pRtree,pRVar30->pParent);
    if (pNode != (RtreeNode *)0x0) {
      pNode->nRef = pNode->nRef + 1;
    }
    pRVar30->pParent = pNode;
  }
  iVar28 = nodeInsertCell(pRtree,pNode,pCell);
  if (iVar28 == 0) {
    iVar28 = AdjustTree(pRtree,pNode,pCell);
    if (iVar28 != 0) {
      return iVar28;
    }
    if (iHeight != 0) {
      iVar28 = parentWrite(pRtree,pCell->iRowid,pNode->iNode);
      return iVar28;
    }
    iVar28 = rowidWrite(pRtree,pCell->iRowid,pNode->iNode);
    return iVar28;
  }
  if ((pRtree->iReinsertHeight < iHeight) && (pNode->iNode != 1)) {
    pRtree->iReinsertHeight = iHeight;
    leftbbox.aCoord[2] = (RtreeCoord)0x0;
    leftbbox.aCoord[3] = (RtreeCoord)0x0;
    leftbbox.aCoord[4] = (RtreeCoord)0x0;
    leftbbox.aCoord[5] = (RtreeCoord)0x0;
    leftbbox.iRowid = 0;
    leftbbox.aCoord[0] = (RtreeCoord)0x0;
    leftbbox.aCoord[1] = (RtreeCoord)0x0;
    leftbbox.aCoord[6] = (RtreeCoord)0x0;
    leftbbox.aCoord[7] = (RtreeCoord)0x0;
    iVar29 = (uint)pNode->zData[2] * 0x100;
    bVar2 = pNode->zData[3];
    uVar40 = iVar29 + (uint)bVar2 + 2 & 0xfffffffe;
    aCell = (RtreeCell *)sqlite3_malloc64((ulong)(uVar40 << 6));
    if (aCell == (RtreeCell *)0x0) {
      return 7;
    }
    iVar28 = iVar29 + (uint)bVar2 + 1;
    pRVar35 = aCell + uVar40;
    uVar39 = (ulong)(iVar29 + (uint)bVar2);
    uVar41 = (ulong)(iVar29 + (uint)bVar2 + 1);
    pRVar38 = aCell + uVar39;
    pRVar37 = aCell->aCoord + 1;
    for (uVar34 = 0; uVar34 != uVar41; uVar34 = uVar34 + 1) {
      if (uVar34 == uVar39) {
        iVar32 = pCell->iRowid;
        uVar22 = *(undefined8 *)pCell->aCoord;
        uVar23 = *(undefined8 *)(pCell->aCoord + 2);
        uVar24 = *(undefined8 *)(pCell->aCoord + 4);
        uVar25 = *(undefined8 *)(pCell->aCoord + 8);
        *(undefined8 *)(pRVar38->aCoord + 6) = *(undefined8 *)(pCell->aCoord + 6);
        *(undefined8 *)(pRVar38->aCoord + 8) = uVar25;
        *(undefined8 *)(pRVar38->aCoord + 2) = uVar23;
        *(undefined8 *)(pRVar38->aCoord + 4) = uVar24;
        pRVar38->iRowid = iVar32;
        *(undefined8 *)pRVar38->aCoord = uVar22;
      }
      else {
        nodeGetCell(pRtree,pNode,(int)uVar34,aCell + uVar34);
      }
      pRVar35->aCoord[uVar34 - 2].i = (int)uVar34;
      bVar3 = pRtree->nDim;
      for (uVar31 = 0; bVar3 != uVar31; uVar31 = uVar31 + 1) {
        if (pRtree->eCoordType == '\0') {
          dVar5 = *(double *)(leftbbox.aCoord + uVar31 * 2 + -2) +
                  (double)pRVar37[uVar31 * 2 + -1].f;
          *(double *)(leftbbox.aCoord + uVar31 * 2 + -2) = dVar5;
          dVar12 = (double)pRVar37[uVar31 * 2].f;
        }
        else {
          dVar5 = *(double *)(leftbbox.aCoord + uVar31 * 2 + -2) +
                  (double)pRVar37[uVar31 * 2 + -1].i;
          *(double *)(leftbbox.aCoord + uVar31 * 2 + -2) = dVar5;
          dVar12 = (double)pRVar37[uVar31 * 2].i;
        }
        *(double *)(leftbbox.aCoord + uVar31 * 2 + -2) = dVar5 + dVar12;
      }
      pRVar37 = pRVar37 + 0xc;
    }
    bVar3 = pRtree->nDim;
    for (uVar34 = 0; bVar3 != uVar34; uVar34 = uVar34 + 1) {
      *(double *)(leftbbox.aCoord + uVar34 * 2 + -2) =
           *(double *)(leftbbox.aCoord + uVar34 * 2 + -2) / (double)(iVar28 * 2);
    }
    aDistance = pRVar35->aCoord + ((ulong)uVar40 - 2) + uVar40;
    pRVar37 = aCell->aCoord;
    for (uVar34 = 0; uVar34 != uVar41; uVar34 = uVar34 + 1) {
      (aDistance + uVar34 * 2)[0] = (RtreeCoord)0x0;
      (aDistance + uVar34 * 2)[1] = (RtreeCoord)0x0;
      dVar5 = 0.0;
      for (uVar31 = 0; bVar3 != uVar31; uVar31 = uVar31 + 1) {
        if (pRtree->eCoordType == '\0') {
          dVar12 = (double)(float)*(undefined8 *)(pRVar37 + uVar31 * 2);
          dVar13 = (double)(float)((ulong)*(undefined8 *)(pRVar37 + uVar31 * 2) >> 0x20);
        }
        else {
          dVar12 = (double)(int)*(undefined8 *)(pRVar37 + uVar31 * 2);
          dVar13 = (double)(int)((ulong)*(undefined8 *)(pRVar37 + uVar31 * 2) >> 0x20);
        }
        dVar12 = (dVar13 - dVar12) - *(double *)(leftbbox.aCoord + uVar31 * 2 + -2);
        dVar5 = dVar5 + dVar12 * dVar12;
        *(double *)(aDistance + uVar34 * 2) = dVar5;
      }
      pRVar37 = pRVar37 + 0xc;
    }
    SortByDistance((int *)pRVar35,iVar28,(RtreeDValue *)&aDistance->f,
                   &pRVar35->aCoord[(ulong)uVar40 - 2].i);
    uVar34 = 0;
    memset(pNode->zData + 2,0,(long)pRtree->iNodeSize - 2);
    pNode->isDirty = 1;
    iVar28 = 0;
    while (iVar28 == 0) {
      uVar41 = (long)(pRtree->iNodeSize + -4) / (long)(int)(uint)pRtree->nBytesPerCell;
      if ((long)(int)((int)((long)((ulong)(uint)((int)uVar41 >> 0x1f) << 0x20 | uVar41 & 0xffffffff)
                           / -3) + iVar29 + (uint)bVar2) <= (long)uVar34) {
        iVar28 = fixBoundingBox(pRtree,pNode);
        break;
      }
      iVar28 = pRVar35->aCoord[uVar34 - 2].i;
      nodeInsertCell(pRtree,pNode,aCell + iVar28);
      lVar43 = aCell[iVar28].iRowid;
      iVar28 = 0;
      if (lVar43 == pCell->iRowid) {
        if (iHeight == 0) {
          iVar28 = rowidWrite(pRtree,lVar43,pNode->iNode);
        }
        else {
          iVar28 = parentWrite(pRtree,lVar43,pNode->iNode);
        }
      }
      uVar34 = uVar34 + 1;
    }
    for (; (iVar28 == 0 && (uVar34 <= uVar39)); uVar34 = uVar34 + 1) {
      iVar29 = pRVar35->aCoord[uVar34 - 2].i;
      iVar28 = ChooseLeaf(pRtree,aCell + iVar29,iHeight,(RtreeNode **)&rightbbox);
      iVar32 = rightbbox.iRowid;
      if (iVar28 == 0) {
        iVar29 = rtreeInsertCell(pRtree,(RtreeNode *)rightbbox.iRowid,aCell + iVar29,iHeight);
        iVar28 = nodeRelease(pRtree,(RtreeNode *)iVar32);
        if (iVar29 != 0) {
          iVar28 = iVar29;
        }
      }
    }
    goto LAB_001c7399;
  }
  uVar27 = *(ushort *)(pNode->zData + 2) << 8 | *(ushort *)(pNode->zData + 2) >> 8;
  iVar28 = 7;
  uVar39 = (ulong)uVar27;
  uVar40 = uVar27 + 1;
  uVar34 = (ulong)uVar40;
  aCell = (RtreeCell *)sqlite3_malloc64(uVar34 * 0x34);
  if (aCell == (RtreeCell *)0x0) {
LAB_001c737a:
    pRVar30 = (RtreeNode *)0x0;
LAB_001c737d:
    pNode_00 = (RtreeNode *)0x0;
  }
  else {
    memset(aCell + uVar34,0,(ulong)(uVar40 * 4));
    pRVar35 = aCell;
    for (uVar41 = 0; uVar39 != uVar41; uVar41 = uVar41 + 1) {
      nodeGetCell(pRtree,pNode,(int)uVar41,pRVar35);
      pRVar35 = pRVar35 + 1;
    }
    memset(pNode->zData + 2,0,(long)pRtree->iNodeSize - 2);
    pNode->isDirty = 1;
    iVar32 = pCell->iRowid;
    uVar22 = *(undefined8 *)pCell->aCoord;
    RVar15 = pCell->aCoord[2];
    RVar16 = pCell->aCoord[3];
    RVar17 = pCell->aCoord[4];
    RVar18 = pCell->aCoord[5];
    RVar19 = pCell->aCoord[7];
    RVar20 = pCell->aCoord[8];
    RVar21 = pCell->aCoord[9];
    pRVar37 = aCell[uVar39].aCoord + 6;
    *pRVar37 = pCell->aCoord[6];
    pRVar37[1] = RVar19;
    pRVar37[2] = RVar20;
    pRVar37[3] = RVar21;
    pRVar37 = aCell[uVar39].aCoord + 2;
    *pRVar37 = RVar15;
    pRVar37[1] = RVar16;
    pRVar37[2] = RVar17;
    pRVar37[3] = RVar18;
    aCell[uVar39].iRowid = iVar32;
    *(undefined8 *)aCell[uVar39].aCoord = uVar22;
    if (pNode->iNode == 1) {
      pNode_00 = nodeNew(pRtree,pNode);
      pRVar30 = nodeNew(pRtree,pNode);
      iVar29 = pRtree->iDepth + 1;
      pRtree->iDepth = iVar29;
      pNode->isDirty = 1;
      uVar27 = (ushort)iVar29;
      *(ushort *)pNode->zData = uVar27 << 8 | uVar27 >> 8;
    }
    else {
      pNode_00 = nodeNew(pRtree,pNode->pParent);
      pNode->nRef = pNode->nRef + 1;
      pRVar30 = pNode;
    }
    if (pNode_00 != (RtreeNode *)0x0 && pRVar30 != (RtreeNode *)0x0) {
      memset(pRVar30->zData,0,(long)pRtree->iNodeSize);
      memset(pNode_00->zData,0,(long)pRtree->iNodeSize);
      n = ((ulong)(uVar40 * 4) + 8) * ((ulong)pRtree->nDim + 1);
      __s = sqlite3_malloc64(n);
      if (__s != (void *)0x0) {
        bVar2 = pRtree->nDim;
        uVar41 = 0;
        memset(__s,0,n);
        pvVar44 = __s;
        while( true ) {
          bVar3 = pRtree->nDim;
          if (bVar3 <= uVar41) break;
          piVar1 = (int *)((long)__s + uVar41 * uVar34 * 4 + (ulong)bVar3 * 8);
          *(int **)((long)__s + uVar41 * 8) = piVar1;
          for (uVar31 = 0; uVar34 != uVar31; uVar31 = uVar31 + 1) {
            *(int *)((long)pvVar44 + uVar31 * 4 + (ulong)bVar3 * 8) = (int)uVar31;
          }
          SortByDimension(pRtree,piVar1,uVar40,(int)uVar41,aCell,
                          (int *)((long)__s + (ulong)(bVar2 * uVar40) * 4 + (ulong)bVar2 * 8));
          uVar41 = uVar41 + 1;
          pvVar44 = (void *)((long)pvVar44 + (ulong)(uVar40 * 4));
        }
        dVar5 = 0.0;
        iVar28 = 0;
        uVar41 = 0;
        for (uVar31 = 0; uVar31 != bVar3; uVar31 = uVar31 + 1) {
          uVar4 = (long)(pRtree->iNodeSize + -4) / (long)(int)(uint)pRtree->nBytesPerCell;
          uVar33 = (int)uVar4 >> 0x1f;
          local_10c = 0;
          dVar12 = 0.0;
          uVar47 = 0;
          uVar48 = 0;
          local_a0 = 0.0;
          lVar42 = (long)(int)((long)((ulong)uVar33 << 0x20 | uVar4 & 0xffffffff) / 3);
          for (lVar43 = lVar42;
              lVar43 <= (int)((int)((long)((ulong)uVar33 << 0x20 | uVar4 & 0xffffffff) / -3) +
                             uVar40); lVar43 = lVar43 + 1) {
            dVar13 = (double)CONCAT44(uVar48,uVar47);
            piVar1 = *(int **)((long)__s + uVar31 * 8);
            iVar29 = *piVar1;
            leftbbox.iRowid = aCell[iVar29].iRowid;
            leftbbox.aCoord._0_8_ = *(undefined8 *)aCell[iVar29].aCoord;
            leftbbox.aCoord._8_8_ = *(undefined8 *)(aCell[iVar29].aCoord + 2);
            leftbbox.aCoord._16_8_ = *(undefined8 *)(aCell[iVar29].aCoord + 2 + 2);
            leftbbox.aCoord._24_8_ = *(undefined8 *)(aCell[iVar29].aCoord + 6);
            leftbbox.aCoord._32_8_ = *(undefined8 *)(aCell[iVar29].aCoord + 6 + 2);
            iVar29 = piVar1[uVar39];
            rightbbox.iRowid = aCell[iVar29].iRowid;
            rightbbox.aCoord._0_8_ = *(undefined8 *)aCell[iVar29].aCoord;
            rightbbox.aCoord._8_8_ = *(undefined8 *)(aCell[iVar29].aCoord + 2);
            rightbbox.aCoord._16_8_ = *(undefined8 *)(aCell[iVar29].aCoord + 2 + 2);
            rightbbox.aCoord._24_8_ = *(undefined8 *)(aCell[iVar29].aCoord + 6);
            rightbbox.aCoord._32_8_ = *(undefined8 *)(aCell[iVar29].aCoord + 6 + 2);
            for (uVar45 = 1; uVar45 < uVar39; uVar45 = uVar45 + 1) {
              pRVar35 = &rightbbox;
              if ((long)uVar45 < lVar43) {
                pRVar35 = &leftbbox;
              }
              cellUnion(pRtree,pRVar35,aCell + piVar1[uVar45]);
            }
            RVar6 = cellMargin(pRtree,&leftbbox);
            RVar7 = cellMargin(pRtree,&rightbbox);
            bVar26 = true;
            dVar49 = 0.0;
            while (bVar26) {
              dVar8 = 1.0;
              for (uVar45 = 0; uVar45 < pRtree->nDim2; uVar45 = uVar45 + 2) {
                if (pRtree->eCoordType == '\0') {
                  fVar46 = leftbbox.aCoord[uVar45].f;
                  if (leftbbox.aCoord[uVar45].f <= rightbbox.aCoord[uVar45].f) {
                    fVar46 = rightbbox.aCoord[uVar45].f;
                  }
                  dVar11 = (double)fVar46;
                  if (rightbbox.aCoord[uVar45 + 1].f <= leftbbox.aCoord[uVar45 + 1].f) {
                    dVar14 = (double)rightbbox.aCoord[uVar45 + 1].f;
                  }
                  else {
                    dVar14 = (double)leftbbox.aCoord[uVar45 + 1].f;
                  }
                }
                else {
                  iVar29 = rightbbox.aCoord[uVar45].i;
                  if (rightbbox.aCoord[uVar45].i < leftbbox.aCoord[uVar45].i) {
                    iVar29 = leftbbox.aCoord[uVar45].i;
                  }
                  dVar11 = (double)iVar29;
                  dVar14 = (double)rightbbox.aCoord[uVar45 + 1].i;
                  if ((double)leftbbox.aCoord[uVar45 + 1].i < (double)rightbbox.aCoord[uVar45 + 1].i
                     ) {
                    dVar14 = (double)leftbbox.aCoord[uVar45 + 1].i;
                  }
                }
                if (dVar14 < dVar11) {
                  dVar8 = 0.0;
                  break;
                }
                dVar8 = dVar8 * (dVar14 - dVar11);
              }
              dVar49 = dVar49 + dVar8;
              bVar26 = false;
            }
            RVar9 = cellArea(pRtree,&leftbbox);
            RVar10 = cellArea(pRtree,&rightbbox);
            if ((lVar43 == lVar42) || (dVar49 < dVar13)) {
LAB_001c6f80:
              uVar47 = SUB84(dVar49,0);
              uVar48 = (undefined4)((ulong)dVar49 >> 0x20);
              local_10c = (int)lVar43;
              local_a0 = RVar10 + RVar9;
            }
            else if ((dVar49 == dVar13) &&
                    ((!NAN(dVar49) && !NAN(dVar13) && (RVar10 + RVar9 < local_a0))))
            goto LAB_001c6f80;
            dVar12 = dVar12 + RVar6 + RVar7;
          }
          if (dVar12 < dVar5 || uVar31 == 0) {
            uVar41 = uVar31 & 0xffffffff;
            dVar5 = dVar12;
            iVar28 = local_10c;
          }
        }
        piVar1 = *(int **)((long)__s + (long)(int)uVar41 * 8);
        iVar29 = *piVar1;
        leftbbox.iRowid = aCell[iVar29].iRowid;
        leftbbox.aCoord._0_8_ = *(undefined8 *)aCell[iVar29].aCoord;
        leftbbox.aCoord._8_8_ = *(undefined8 *)(aCell[iVar29].aCoord + 2);
        leftbbox.aCoord._16_8_ = *(undefined8 *)(aCell[iVar29].aCoord + 2 + 2);
        leftbbox.aCoord._24_8_ = *(undefined8 *)(aCell[iVar29].aCoord + 6);
        leftbbox.aCoord._32_8_ = *(undefined8 *)(aCell[iVar29].aCoord + 6 + 2);
        lVar43 = (long)iVar28;
        iVar28 = piVar1[lVar43];
        rightbbox.iRowid = aCell[iVar28].iRowid;
        rightbbox.aCoord._0_8_ = *(undefined8 *)aCell[iVar28].aCoord;
        rightbbox.aCoord._8_8_ = *(undefined8 *)(aCell[iVar28].aCoord + 2);
        rightbbox.aCoord._16_8_ = *(undefined8 *)(aCell[iVar28].aCoord + 2 + 2);
        rightbbox.aCoord._24_8_ = *(undefined8 *)(aCell[iVar28].aCoord + 6);
        rightbbox.aCoord._32_8_ = *(undefined8 *)(aCell[iVar28].aCoord + 6 + 2);
        for (uVar39 = 0; uVar34 != uVar39; uVar39 = uVar39 + 1) {
          pRVar36 = pNode_00;
          if ((long)uVar39 < lVar43) {
            pRVar36 = pRVar30;
          }
          pRVar35 = &rightbbox;
          if ((long)uVar39 < lVar43) {
            pRVar35 = &leftbbox;
          }
          iVar28 = *(int *)(*(long *)((long)__s + (long)(int)uVar41 * 8) + uVar39 * 4);
          nodeInsertCell(pRtree,pRVar36,aCell + iVar28);
          cellUnion(pRtree,pRVar35,aCell + iVar28);
        }
        sqlite3_free(__s);
        iVar28 = nodeWrite(pRtree,pNode_00);
        if (iVar28 == 0) {
          lVar43 = pRVar30->iNode;
          if (lVar43 == 0) {
            iVar28 = nodeWrite(pRtree,pRVar30);
            if (iVar28 != 0) goto LAB_001c737f;
            lVar43 = pRVar30->iNode;
          }
          rightbbox.iRowid = pNode_00->iNode;
          pRVar36 = pRVar30->pParent;
          leftbbox.iRowid = lVar43;
          if (pNode->iNode == 1) {
            iVar28 = rtreeInsertCell(pRtree,pRVar36,&leftbbox,iHeight + 1);
          }
          else {
            iVar28 = nodeParentIndex(pRtree,pRVar30,&local_a4);
            if (iVar28 != 0) goto LAB_001c737f;
            nodeOverwriteCell(pRtree,pRVar36,&leftbbox,local_a4);
            iVar28 = AdjustTree(pRtree,pRVar36,&leftbbox);
          }
          if ((iVar28 == 0) &&
             (iVar28 = rtreeInsertCell(pRtree,pNode_00->pParent,&rightbbox,iHeight + 1), iVar28 == 0
             )) {
            bVar26 = false;
            for (uVar40 = 0;
                uVar40 < (ushort)(*(ushort *)(pNode_00->zData + 2) << 8 |
                                 *(ushort *)(pNode_00->zData + 2) >> 8); uVar40 = uVar40 + 1) {
              iVar32 = nodeGetRowid(pRtree,pNode_00,uVar40);
              iVar28 = updateMapping(pRtree,iVar32,pNode_00,iHeight);
              if (iVar28 != 0) goto LAB_001c737f;
              if (iVar32 == pCell->iRowid) {
                bVar26 = true;
              }
            }
            if (pNode->iNode == 1) {
              uVar40 = 0;
              do {
                if ((ushort)(*(ushort *)(pRVar30->zData + 2) << 8 |
                            *(ushort *)(pRVar30->zData + 2) >> 8) <= uVar40) goto LAB_001c7356;
                iVar32 = nodeGetRowid(pRtree,pRVar30,uVar40);
                iVar28 = updateMapping(pRtree,iVar32,pRVar30,iHeight);
                uVar40 = uVar40 + 1;
              } while (iVar28 == 0);
            }
            else if ((bVar26) ||
                    (iVar28 = updateMapping(pRtree,pCell->iRowid,pRVar30,iHeight), iVar28 == 0)) {
LAB_001c7356:
              iVar28 = nodeRelease(pRtree,pNode_00);
              if (iVar28 == 0) {
                iVar28 = nodeRelease(pRtree,pRVar30);
                goto LAB_001c737a;
              }
              goto LAB_001c737d;
            }
          }
        }
      }
    }
  }
LAB_001c737f:
  nodeRelease(pRtree,pNode_00);
  nodeRelease(pRtree,pRVar30);
LAB_001c7399:
  sqlite3_free(aCell);
  return iVar28;
}

Assistant:

static int rtreeInsertCell(
  Rtree *pRtree,
  RtreeNode *pNode,
  RtreeCell *pCell,
  int iHeight
){
  int rc = SQLITE_OK;
  if( iHeight>0 ){
    RtreeNode *pChild = nodeHashLookup(pRtree, pCell->iRowid);
    if( pChild ){
      nodeRelease(pRtree, pChild->pParent);
      nodeReference(pNode);
      pChild->pParent = pNode;
    }
  }
  if( nodeInsertCell(pRtree, pNode, pCell) ){
    if( iHeight<=pRtree->iReinsertHeight || pNode->iNode==1){
      rc = SplitNode(pRtree, pNode, pCell, iHeight);
    }else{
      pRtree->iReinsertHeight = iHeight;
      rc = Reinsert(pRtree, pNode, pCell, iHeight);
    }
  }else{
    rc = AdjustTree(pRtree, pNode, pCell);
    if( rc==SQLITE_OK ){
      if( iHeight==0 ){
        rc = rowidWrite(pRtree, pCell->iRowid, pNode->iNode);
      }else{
        rc = parentWrite(pRtree, pCell->iRowid, pNode->iNode);
      }
    }
  }
  return rc;
}